

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O1

void __thiscall Diligent::DeviceContextVkImpl::InvalidateState(DeviceContextVkImpl *this)

{
  ResourceBindInfo *pRVar1;
  ShaderResourceCacheVk **ppSVar2;
  undefined4 uVar3;
  RenderingInfoWrapper *__ptr;
  pointer pVVar4;
  ShaderResourceCacheVk *pSVar5;
  ShaderResourceCacheVk *pSVar6;
  ShaderResourceCacheVk *pSVar7;
  ShaderResourceCacheVk *pSVar8;
  ShaderResourceCacheVk *pSVar9;
  ShaderResourceCacheVk *pSVar10;
  ShaderResourceCacheVk *pSVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  long lVar15;
  undefined1 *puVar16;
  array<Diligent::RefCntWeakPtr<Diligent::ShaderResourceBindingVkImpl>,_8UL> *paVar17;
  long lVar18;
  undefined1 *puVar19;
  string _msg;
  string local_600;
  undefined8 local_5e0 [4];
  undefined1 local_5c0 [128];
  undefined8 local_540 [4];
  undefined8 local_520;
  undefined1 auStack_518 [24];
  undefined1 local_500 [232];
  undefined8 auStack_418 [85];
  undefined1 local_170 [320];
  
  if ((this->m_State).NumCommands != 0) {
    FormatString<char[104]>
              (&local_600,
               (char (*) [104])
               "Invalidating context that has outstanding commands in it. Call Flush() to submit commands for execution"
              );
    if (DebugMessageCallback != (undefined *)0x0) {
      (*(code *)DebugMessageCallback)(1,local_600._M_dataplus._M_p,0,0,0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_600._M_dataplus._M_p != &local_600.field_2) {
      operator_delete(local_600._M_dataplus._M_p,local_600.field_2._M_allocated_capacity + 1);
    }
  }
  if ((this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
      super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pActiveRenderPass.m_pObject !=
      (RenderPassVkImpl *)0x0) {
    FormatString<char[92]>
              (&local_600,
               (char (*) [92])
               "Invalidating context inside an active render pass. Call EndRenderPass() to finish the pass."
              );
    DebugAssertionFailed
              (local_600._M_dataplus._M_p,"InvalidateState",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x335);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_600._M_dataplus._M_p != &local_600.field_2) {
      operator_delete(local_600._M_dataplus._M_p,local_600.field_2._M_allocated_capacity + 1);
    }
  }
  DeviceContextBase<Diligent::EngineVkImplTraits>::ClearStateCache
            ((DeviceContextBase<Diligent::EngineVkImplTraits> *)this);
  (this->m_State).CommittedVBsUpToDate = false;
  (this->m_State).CommittedIBUpToDate = false;
  (this->m_State).ShadingRateIsSet = false;
  (this->m_State).NullRenderTargets = false;
  (this->m_State).NumCommands = 0;
  (this->m_State).vkPipelineBindPoint = VK_PIPELINE_BIND_POINT_MAX_ENUM;
  puVar16 = local_500;
  lVar18 = 0;
  do {
    memset((void *)((long)local_5e0 + lVar18 + -0x20),0,0xe4);
    lVar15 = 0;
    do {
      *(undefined8 *)(puVar16 + lVar15 + -0x18) = 0;
      *(undefined8 *)((long)(puVar16 + lVar15 + -0x18) + 8) = 0;
      *(undefined8 *)(puVar16 + lVar15 + -8) = 0;
      *(undefined4 *)(puVar16 + lVar15) = 0xffffffff;
      lVar15 = lVar15 + 0x20;
    } while (lVar15 != 0x100);
    *(undefined8 *)((long)auStack_418 + lVar18) = 0;
    lVar18 = lVar18 + 0x1f0;
    puVar16 = puVar16 + 0x1f0;
  } while (lVar18 != 0x5d0);
  puVar16 = local_5c0;
  paVar17 = &(this->m_BindInfo)._M_elems[0].super_CommittedShaderResources.SRBs;
  lVar18 = 0;
  do {
    pSVar5 = (ShaderResourceCacheVk *)local_5e0[lVar18 * 0x3e + -4];
    pSVar6 = (ShaderResourceCacheVk *)local_5e0[lVar18 * 0x3e + -3];
    pSVar7 = (ShaderResourceCacheVk *)local_5e0[lVar18 * 0x3e + -2];
    pSVar8 = (ShaderResourceCacheVk *)local_5e0[lVar18 * 0x3e + -1];
    pSVar9 = (ShaderResourceCacheVk *)local_5e0[lVar18 * 0x3e];
    pSVar10 = (ShaderResourceCacheVk *)local_5e0[lVar18 * 0x3e + 1];
    pSVar11 = *(ShaderResourceCacheVk **)(local_5c0 + lVar18 * 0x1f0 + -8);
    ppSVar2 = (this->m_BindInfo)._M_elems[lVar18].super_CommittedShaderResources.ResourceCaches.
              _M_elems + 6;
    *ppSVar2 = (ShaderResourceCacheVk *)local_5e0[lVar18 * 0x3e + 2];
    ppSVar2[1] = pSVar11;
    ppSVar2 = (this->m_BindInfo)._M_elems[lVar18].super_CommittedShaderResources.ResourceCaches.
              _M_elems + 4;
    *ppSVar2 = pSVar9;
    ppSVar2[1] = pSVar10;
    ppSVar2 = (this->m_BindInfo)._M_elems[lVar18].super_CommittedShaderResources.ResourceCaches.
              _M_elems + 2;
    *ppSVar2 = pSVar7;
    ppSVar2[1] = pSVar8;
    pRVar1 = (this->m_BindInfo)._M_elems + lVar18;
    (pRVar1->super_CommittedShaderResources).ResourceCaches._M_elems[0] = pSVar5;
    (pRVar1->super_CommittedShaderResources).ResourceCaches._M_elems[1] = pSVar6;
    lVar15 = 0;
    do {
      if (*(long *)((long)&paVar17->_M_elems[0].m_pRefCounters + lVar15) !=
          *(long *)(puVar16 + lVar15)) {
        RefCntWeakPtr<Diligent::ShaderResourceBindingVkImpl>::Release
                  ((RefCntWeakPtr<Diligent::ShaderResourceBindingVkImpl> *)
                   ((long)&paVar17->_M_elems[0].m_pRefCounters + lVar15));
        *(undefined8 *)((long)&paVar17->_M_elems[0].m_pObject + lVar15) =
             *(undefined8 *)(puVar16 + lVar15 + 8);
        *(undefined8 *)((long)&paVar17->_M_elems[0].m_pRefCounters + lVar15) =
             *(undefined8 *)(puVar16 + lVar15);
        *(undefined8 *)(puVar16 + lVar15) = 0;
        *(undefined8 *)((long)(puVar16 + lVar15) + 8) = 0;
      }
      lVar15 = lVar15 + 0x10;
    } while (lVar15 != 0x80);
    uVar3 = *(undefined4 *)(&local_520 + lVar18 * 0x3e);
    pRVar1 = (this->m_BindInfo)._M_elems + lVar18;
    (pRVar1->super_CommittedShaderResources).ResourcesValidated = (bool)(char)uVar3;
    (pRVar1->super_CommittedShaderResources).ActiveSRBMask = (char)((uint)uVar3 >> 8);
    (pRVar1->super_CommittedShaderResources).StaleSRBMask = (char)((uint)uVar3 >> 0x10);
    (pRVar1->super_CommittedShaderResources).DynamicSRBMask = (char)((uint)uVar3 >> 0x18);
    uVar12 = local_540[lVar18 * 0x3e];
    uVar13 = local_540[lVar18 * 0x3e + 1];
    uVar14 = (&local_520)[lVar18 * 0x3e + -1];
    *(undefined8 *)
     ((this->m_BindInfo)._M_elems[lVar18].super_CommittedShaderResources.CacheRevisions._M_elems + 4
     ) = local_540[lVar18 * 0x3e + 2];
    *(undefined8 *)
     ((this->m_BindInfo)._M_elems[lVar18].super_CommittedShaderResources.CacheRevisions._M_elems + 6
     ) = uVar14;
    *(undefined8 *)
     (this->m_BindInfo)._M_elems[lVar18].super_CommittedShaderResources.CacheRevisions._M_elems =
         uVar12;
    *(undefined8 *)
     ((this->m_BindInfo)._M_elems[lVar18].super_CommittedShaderResources.CacheRevisions._M_elems + 2
     ) = uVar13;
    memcpy(&(this->m_BindInfo)._M_elems[lVar18].SetInfo,auStack_518 + lVar18 * 0x1f0,0x108);
    lVar18 = lVar18 + 1;
    puVar16 = puVar16 + 0x1f0;
    paVar17 = (array<Diligent::RefCntWeakPtr<Diligent::ShaderResourceBindingVkImpl>,_8UL> *)
              ((long)(paVar17 + 3) + 0x70);
  } while (lVar18 != 3);
  puVar16 = &stack0xffffffffffffffd0;
  puVar19 = local_170;
  do {
    puVar16 = puVar16 + -0x1f0;
    lVar18 = 0;
    do {
      RefCntWeakPtr<Diligent::ShaderResourceBindingVkImpl>::Release
                ((RefCntWeakPtr<Diligent::ShaderResourceBindingVkImpl> *)(puVar19 + lVar18));
      lVar18 = lVar18 + -0x10;
    } while (lVar18 != -0x80);
    puVar19 = puVar19 + -0x1f0;
  } while ((string *)puVar16 != &local_600);
  this->m_vkRenderPass = (VkRenderPass)0x0;
  this->m_vkFramebuffer = (VkFramebuffer)0x0;
  __ptr = (this->m_DynamicRenderingInfo)._M_t.
          super___uniq_ptr_impl<VulkanUtilities::RenderingInfoWrapper,_std::default_delete<VulkanUtilities::RenderingInfoWrapper>_>
          ._M_t.
          super__Tuple_impl<0UL,_VulkanUtilities::RenderingInfoWrapper_*,_std::default_delete<VulkanUtilities::RenderingInfoWrapper>_>
          .super__Head_base<0UL,_VulkanUtilities::RenderingInfoWrapper_*,_false>._M_head_impl;
  (this->m_DynamicRenderingInfo)._M_t.
  super___uniq_ptr_impl<VulkanUtilities::RenderingInfoWrapper,_std::default_delete<VulkanUtilities::RenderingInfoWrapper>_>
  ._M_t.
  super__Tuple_impl<0UL,_VulkanUtilities::RenderingInfoWrapper_*,_std::default_delete<VulkanUtilities::RenderingInfoWrapper>_>
  .super__Head_base<0UL,_VulkanUtilities::RenderingInfoWrapper_*,_false>._M_head_impl =
       (RenderingInfoWrapper *)0x0;
  if (__ptr != (RenderingInfoWrapper *)0x0) {
    std::default_delete<VulkanUtilities::RenderingInfoWrapper>::operator()
              ((default_delete<VulkanUtilities::RenderingInfoWrapper> *)
               &this->m_DynamicRenderingInfo,__ptr);
  }
  if (((this->m_CommandBuffer).m_State.RenderPass != (VkRenderPass)0x0) ||
     ((this->m_CommandBuffer).m_State.DynamicRenderingHash != 0)) {
    FormatString<char[49]>
              (&local_600,(char (*) [49])"Invalidating context with unfinished render pass");
    DebugAssertionFailed
              (local_600._M_dataplus._M_p,"InvalidateState",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0x677);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_600._M_dataplus._M_p != &local_600.field_2) {
      operator_delete(local_600._M_dataplus._M_p,local_600.field_2._M_allocated_capacity + 1);
    }
  }
  (this->m_CommandBuffer).m_State.IndexBuffer = (VkBuffer)0x0;
  (this->m_CommandBuffer).m_State.IndexBufferOffset = 0;
  (this->m_CommandBuffer).m_State.ComputePipeline = (VkPipeline)0x0;
  (this->m_CommandBuffer).m_State.RayTracingPipeline = (VkPipeline)0x0;
  (this->m_CommandBuffer).m_State.Framebuffer = (VkFramebuffer)0x0;
  (this->m_CommandBuffer).m_State.GraphicsPipeline = (VkPipeline)0x0;
  (this->m_CommandBuffer).m_VkCmdBuffer = (VkCommandBuffer)0x0;
  (this->m_CommandBuffer).m_State.RenderPass = (VkRenderPass)0x0;
  (this->m_CommandBuffer).m_State.IndexType = VK_INDEX_TYPE_MAX_ENUM;
  (this->m_CommandBuffer).m_State.FramebufferWidth = 0;
  (this->m_CommandBuffer).m_State.FramebufferHeight = 0;
  (this->m_CommandBuffer).m_State.InsidePassQueries = 0;
  (this->m_CommandBuffer).m_State.OutsidePassQueries = 0;
  (this->m_CommandBuffer).m_Barrier.MemorySrcAccess = 0;
  (this->m_CommandBuffer).m_Barrier.MemoryDstAccess = 0;
  (this->m_CommandBuffer).m_Barrier.ImageSrcStages = 0;
  (this->m_CommandBuffer).m_Barrier.ImageDstStages = 0;
  (this->m_CommandBuffer).m_State.DynamicRenderingHash = 0;
  (this->m_CommandBuffer).m_Barrier.MemorySrcStages = 0;
  (this->m_CommandBuffer).m_Barrier.MemoryDstStages = 0;
  (this->m_CommandBuffer).m_Barrier.SupportedStagesMask = 0xffffffff;
  (this->m_CommandBuffer).m_Barrier.SupportedAccessMask = 0xffffffff;
  pVVar4 = (this->m_CommandBuffer).m_ImageBarriers.
           super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->m_CommandBuffer).m_ImageBarriers.
      super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>._M_impl.
      super__Vector_impl_data._M_finish != pVVar4) {
    (this->m_CommandBuffer).m_ImageBarriers.
    super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>._M_impl.
    super__Vector_impl_data._M_finish = pVVar4;
  }
  return;
}

Assistant:

void DeviceContextVkImpl::InvalidateState()
{
    if (m_State.NumCommands != 0)
        LOG_WARNING_MESSAGE("Invalidating context that has outstanding commands in it. Call Flush() to submit commands for execution");

    TDeviceContextBase::InvalidateState();
    m_State         = {};
    m_BindInfo      = {};
    m_vkRenderPass  = VK_NULL_HANDLE;
    m_vkFramebuffer = VK_NULL_HANDLE;
    m_DynamicRenderingInfo.reset();

    VERIFY(!m_CommandBuffer.IsInRenderScope(), "Invalidating context with unfinished render pass");
    m_CommandBuffer.Reset();
}